

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

int Sml_NodeCheckImp(Fra_Sml_t *p,int Left,int Right)

{
  uint *puVar1;
  uint *puVar2;
  int local_34;
  int k;
  uint *pSimR;
  uint *pSimL;
  int Right_local;
  int Left_local;
  Fra_Sml_t *p_local;
  
  puVar1 = Fra_ObjSim(p,Left);
  puVar2 = Fra_ObjSim(p,Right);
  local_34 = p->nWordsPref;
  while( true ) {
    if (p->nWordsTotal <= local_34) {
      return 1;
    }
    if ((puVar1[local_34] & (puVar2[local_34] ^ 0xffffffff)) != 0) break;
    local_34 = local_34 + 1;
  }
  return 0;
}

Assistant:

static inline int Sml_NodeCheckImp( Fra_Sml_t * p, int Left, int Right )
{
    unsigned * pSimL, * pSimR;
    int k;
    pSimL = Fra_ObjSim( p, Left );
    pSimR = Fra_ObjSim( p, Right );
    for ( k = p->nWordsPref; k < p->nWordsTotal; k++ )
        if ( pSimL[k] & ~pSimR[k] )
            return 0;
    return 1;
}